

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O0

void __thiscall Satyricon::Literal_Heap::heapify(Literal_Heap *this,size_type i)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  char *pcVar6;
  const_reference pvVar7;
  reference __b;
  reference __a;
  reference __b_00;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  char *local_20;
  size_type largest;
  size_type i_local;
  Literal_Heap *this_local;
  
  sVar3 = left(this,i);
  sVar4 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->value);
  local_20 = (char *)i;
  if (sVar3 < sVar4) {
    pvVar2 = this->activity;
    pcVar6 = (char *)i;
    pvVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->value,i);
    pcVar6 = Literal::index(pvVar5,pcVar6,__c);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar2,(ulong)pcVar6 & 0xffffffff);
    dVar1 = *pvVar7;
    pvVar2 = this->activity;
    pcVar6 = (char *)left(this,i);
    pvVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->value,(size_type)pcVar6);
    pcVar6 = Literal::index(pvVar5,pcVar6,__c_00);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar2,(ulong)pcVar6 & 0xffffffff);
    if (dVar1 < *pvVar7) {
      local_20 = (char *)left(this,i);
    }
  }
  sVar3 = right(this,i);
  sVar4 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->value);
  if (sVar3 < sVar4) {
    pvVar2 = this->activity;
    pcVar6 = local_20;
    pvVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->value,(size_type)local_20);
    pcVar6 = Literal::index(pvVar5,pcVar6,__c_01);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar2,(ulong)pcVar6 & 0xffffffff);
    dVar1 = *pvVar7;
    pvVar2 = this->activity;
    pcVar6 = (char *)right(this,i);
    pvVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->value,(size_type)pcVar6);
    pcVar6 = Literal::index(pvVar5,pcVar6,__c_02);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (pvVar2,(ulong)pcVar6 & 0xffffffff);
    if (dVar1 < *pvVar7) {
      local_20 = (char *)right(this,i);
    }
  }
  if (local_20 != (char *)i) {
    pvVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->value,i);
    __b = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                    (&this->value,(size_type)local_20);
    std::swap<Satyricon::Literal>(pvVar5,__b);
    pvVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->value,i);
    pcVar6 = Literal::index(pvVar5,(char *)i,__c_03);
    __a = std::vector<int,_std::allocator<int>_>::operator[]
                    (&this->map_position,(ulong)pcVar6 & 0xffffffff);
    pcVar6 = local_20;
    pvVar5 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::operator[]
                       (&this->value,(size_type)local_20);
    pcVar6 = Literal::index(pvVar5,pcVar6,__c_04);
    __b_00 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->map_position,(ulong)pcVar6 & 0xffffffff);
    std::swap<int>(__a,__b_00);
    heapify(this,(size_type)local_20);
  }
  return;
}

Assistant:

void heapify(size_type i) {
        //std::cout <<"heapify " << i << " " << left(i) << " " << right(i) << std::endl;
        auto largest = i;
        if (left(i) < value.size()  && activity[value[largest].index()] < activity[value[left(i)].index()] )
            largest = left(i);
        if (right(i) < value.size()  && activity[value[largest].index()] < activity[value[right(i)].index()] )
            largest = right(i);

        if ( largest != i ) {
            std::swap(value[i],value[largest]);
            std::swap(map_position[value[i].index()],
                    map_position[value[largest].index()]);

            heapify(largest);
        }
    }